

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadScene(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  pointer ppVar5;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  iterator local_c0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>
  local_b8;
  allocator<char> local_a9;
  key_type local_a8;
  iterator local_88;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>
  local_80;
  const_iterator sit;
  string local_70;
  char *local_50;
  char *url;
  int urlIndex;
  allocator<char> local_31;
  string local_30;
  ColladaParser *local_10;
  ColladaParser *this_local;
  
  local_10 = this;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"instance_visual_scene");
        if (bVar1) {
          if (this->mRootNode != (Node *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_30,
                       "Invalid scene containing multiple root nodes in <instance_visual_scene> element"
                       ,&local_31);
            ThrowException(this,&local_30);
          }
          url._0_4_ = GetAttribute(this,"url");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)(uint)url);
          local_50 = (char *)CONCAT44(extraout_var,iVar3);
          if (*local_50 != '#') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,
                       "Unknown reference format in <instance_visual_scene> element",
                       (allocator<char> *)((long)&sit._M_node + 7));
            ThrowException(this,&local_70);
          }
          pcVar4 = local_50 + 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar4,&local_a9);
          local_88._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
               ::find(&this->mNodeLibrary,&local_a8);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>
          ::_Rb_tree_const_iterator(&local_80,&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator(&local_a9);
          local_c0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
               ::end(&this->mNodeLibrary);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>
          ::_Rb_tree_const_iterator(&local_b8,&local_c0);
          bVar1 = std::operator==(&local_80,&local_b8);
          pcVar4 = local_50;
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,pcVar4,&local_121);
            std::operator+(&local_100,"Unable to resolve visual_scene reference \"",&local_120);
            std::operator+(&local_e0,&local_100,"\" in <instance_visual_scene> element.");
            ThrowException(this,&local_e0);
          }
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>
                   ::operator->(&local_80);
          this->mRootNode = ppVar5->second;
        }
        else {
          SkipElement(this);
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
  }
  return;
}

Assistant:

void ColladaParser::ReadScene()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("instance_visual_scene"))
            {
                // should be the first and only occurrence
                if (mRootNode)
                    ThrowException("Invalid scene containing multiple root nodes in <instance_visual_scene> element");

                // read the url of the scene to instance. Should be of format "#some_name"
                int urlIndex = GetAttribute("url");
                const char* url = mReader->getAttributeValue(urlIndex);
                if (url[0] != '#')
                    ThrowException("Unknown reference format in <instance_visual_scene> element");

                // find the referred scene, skip the leading #
                NodeLibrary::const_iterator sit = mNodeLibrary.find(url + 1);
                if (sit == mNodeLibrary.end())
                    ThrowException("Unable to resolve visual_scene reference \"" + std::string(url) + "\" in <instance_visual_scene> element.");
                mRootNode = sit->second;
            }
            else {
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}